

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::Precipitation> metaf::Precipitation::fromRainfallString(string *s)

{
  _Optional_base<metaf::Precipitation,_true,_true> _Var1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  optional<unsigned_int> oVar5;
  uint *puVar6;
  string *in_RDI;
  Precipitation *__t;
  Precipitation precipitation;
  optional<unsigned_int> intPart;
  optional<unsigned_int> fractPart;
  Precipitation *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string *str;
  string *__u;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffffdc;
  size_t in_stack_ffffffffffffffe0;
  string *str_00;
  _Optional_payload_base<float> local_10;
  undefined8 local_8;
  
  bVar2 = std::operator==(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  if (!bVar2) {
    bVar2 = std::operator==(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
    if (!bVar2) {
      lVar3 = std::__cxx11::string::length();
      if (lVar3 != 4) {
        lVar3 = std::__cxx11::string::length();
        if (lVar3 != 5) {
          local_10 = (_Optional_payload_base<float>)0;
          local_8 = 0;
          goto LAB_0025fc15;
        }
      }
      __u = in_RDI;
      std::__cxx11::string::length();
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
      if (*pcVar4 == '.') {
        str = __u;
        std::__cxx11::string::length();
        oVar5 = strToUint(str,in_stack_ffffffffffffffe0,
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        uVar7 = oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._4_4_;
        bVar2 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x25fb34);
        if (bVar2) {
          str_00 = str;
          std::__cxx11::string::length();
          strToUint(str_00,in_stack_ffffffffffffffe0,CONCAT44(in_stack_ffffffffffffffdc,uVar7));
          bVar2 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x25fb8d);
          if (bVar2) {
            Precipitation((Precipitation *)str);
            puVar6 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x25fbbf);
            __t = (Precipitation *)(double)*puVar6;
            std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x25fbd5);
            std::optional<float>::operator=((optional<float> *)in_RDI,(double *)__u);
            std::optional<metaf::Precipitation>::optional<metaf::Precipitation,_true>
                      ((optional<metaf::Precipitation> *)str,__t);
          }
          else {
            local_10 = (_Optional_payload_base<float>)0;
            local_8 = 0;
          }
        }
        else {
          local_10 = (_Optional_payload_base<float>)0;
          local_8 = 0;
        }
      }
      else {
        local_10 = (_Optional_payload_base<float>)0;
        local_8 = 0;
      }
      goto LAB_0025fc15;
    }
  }
  memset(&stack0xffffffffffffffdc,0,0xc);
  Precipitation((Precipitation *)in_stack_ffffffffffffffa0);
  std::optional<metaf::Precipitation>::optional<metaf::Precipitation,_true>
            ((optional<metaf::Precipitation> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
LAB_0025fc15:
  _Var1._M_payload.super__Optional_payload_base<metaf::Precipitation>._8_8_ = local_8;
  _Var1._M_payload.super__Optional_payload_base<metaf::Precipitation>._M_payload._M_value.
  precipValue.super__Optional_base<float,_true,_true>._M_payload.super__Optional_payload_base<float>
       = (optional<float>)(optional<float>)local_10;
  return (_Optional_base<metaf::Precipitation,_true,_true>)
         (_Optional_base<metaf::Precipitation,_true,_true>)
         _Var1._M_payload.super__Optional_payload_base<metaf::Precipitation>;
}

Assistant:

std::optional<Precipitation> Precipitation::fromRainfallString(const std::string & s) {
	//static const std::regex rgx("\\d?\\d\\d\\.\\d");
	static const std::optional<Precipitation> error;
	if (s == "///./" || s == "//./") return Precipitation();
	if (s.length() != 4 && s.length() != 5) return error;
	if (s[s.length()-2] != '.') return error;
	const auto fractPart = strToUint(s, s.length() - 1, 1);
	if (!fractPart.has_value()) return error;
	const auto intPart = strToUint(s, 0, s.length() - 2);
	if (!intPart.has_value()) return error;
	Precipitation precipitation;
	precipitation.precipValue = *intPart + 0.1 * *fractPart;
	return precipitation;
}